

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::velocity_advection_update(NavierStokesBase *this,Real dt)

{
  Real RVar1;
  Real RVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  bool bVar5;
  MFIter *mfi_00;
  int *piVar6;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  Box *bx_2;
  MFIter mfi_2;
  IntVect mpt_1;
  Box *bx_1;
  MFIter mfi_1;
  IntVect mpt;
  int sigma;
  int mom_diff;
  Array4<double> *rho_Half;
  Array4<double> *rho_new;
  Array4<double> *rho_old;
  Array4<double> *advec;
  Array4<double> *force;
  Array4<double> *gradp;
  Array4<double> *vel_new;
  Array4<double> *vel_old;
  Array4<double> *force_1;
  Elixir tf_i;
  Real half_time;
  Array4<double> *scal_n;
  Array4<double> *scal_o;
  Array4<double> *scal;
  Elixir scal_i;
  FArrayBox *VelFAB;
  Box *bx;
  MFIter mfi;
  FArrayBox ScalFAB;
  FArrayBox tforces;
  MultiFab Vel;
  MultiFab *Rh;
  MultiFab *Gp;
  MultiFab *Aofs;
  MultiFab *U_new;
  MultiFab *U_old;
  undefined8 in_stack_ffffffffffffe8d8;
  int state_indx;
  undefined4 in_stack_ffffffffffffe8e0;
  int in_stack_ffffffffffffe8e4;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe8e8;
  undefined4 in_stack_ffffffffffffe8f0;
  int in_stack_ffffffffffffe8f4;
  Print *in_stack_ffffffffffffe8f8;
  Print *in_stack_ffffffffffffe900;
  FabArrayBase *in_stack_ffffffffffffe908;
  Print *in_stack_ffffffffffffe910;
  BoxArray *in_stack_ffffffffffffe918;
  MultiFab *in_stack_ffffffffffffe920;
  anon_class_528_10_c363ed05 *in_stack_ffffffffffffe928;
  undefined4 in_stack_ffffffffffffe930;
  int in_stack_ffffffffffffe934;
  Box *in_stack_ffffffffffffe938;
  Print *in_stack_ffffffffffffe940;
  Print *in_stack_ffffffffffffe950;
  IntVect *in_stack_ffffffffffffe990;
  Box *in_stack_ffffffffffffe998;
  Box *in_stack_ffffffffffffe9a0;
  FArrayBox *in_stack_ffffffffffffe9a8;
  NavierStokesBase *in_stack_ffffffffffffeb10;
  undefined1 local_1424 [28];
  undefined1 *local_1408;
  MFIter local_1400;
  IntVect local_139c [15];
  Array<const_MultiFab_*,_3> *in_stack_ffffffffffffed18;
  int in_stack_ffffffffffffed24;
  MultiFab *in_stack_ffffffffffffed28;
  undefined1 local_107c [28];
  undefined1 *local_1060;
  MFIter local_1058;
  IntVect local_ff4 [34];
  int local_e5c;
  undefined1 local_e58 [64];
  undefined1 auStack_e18 [64];
  undefined1 auStack_dd8 [64];
  undefined1 auStack_d98 [64];
  undefined1 auStack_d58 [64];
  undefined1 auStack_d18 [64];
  undefined1 auStack_cd8 [64];
  undefined1 auStack_c98 [64];
  int local_c58;
  undefined8 local_c50;
  int local_c44;
  undefined1 local_c40 [64];
  undefined1 *local_c00;
  undefined1 local_bf8 [64];
  undefined1 *local_bb8;
  undefined1 local_bb0 [64];
  undefined1 *local_b70;
  undefined1 local_b68 [64];
  undefined1 *local_b28;
  Array4<double> local_b20;
  Array4<double> *local_ae0;
  IntVect local_ad8 [5];
  IntVect *local_a98;
  undefined1 local_a90 [64];
  undefined1 *local_a50;
  undefined1 local_a48 [64];
  undefined1 *local_a08;
  undefined1 local_a00 [64];
  Array4<double> local_9c0;
  Array4<double> *local_980;
  double local_960;
  double *local_958;
  Long LStack_950;
  Long local_948;
  Long LStack_940;
  undefined8 uStack_938;
  undefined4 uStack_930;
  undefined4 local_92c;
  undefined4 uStack_928;
  undefined8 uStack_924;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 uStack_8f8;
  undefined4 uStack_8f0;
  undefined4 local_8ec;
  undefined4 uStack_8e8;
  undefined8 uStack_8e4;
  undefined1 local_890 [64];
  undefined1 *local_850;
  undefined8 local_848 [8];
  undefined8 *local_808;
  Array4<double> local_800;
  Array4<double> *local_7c0;
  undefined1 local_7b2;
  undefined1 local_7b1;
  FArrayBox *local_610;
  Box local_604;
  Box *local_5e8;
  undefined1 local_5e0 [112];
  element_type *local_570;
  undefined1 auStack_568 [12];
  int iStack_55c;
  int local_558;
  int iStack_554;
  int local_54c;
  FArrayBox local_538;
  __uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  local_4f0;
  DataAllocator local_4e8;
  long local_4e0;
  pointer local_4c8;
  void *pvStack_4c0;
  MultiArray4<double> local_4b8;
  MultiArray4<const_double> MStack_4b0;
  pointer local_4a8;
  MultiFab *local_320;
  MultiFab *local_318;
  long local_310;
  MultiFab *local_308;
  MultiFab *local_300;
  undefined8 local_2f8;
  FArrayBox *local_2e8;
  FArrayBox *local_2e0;
  undefined1 *local_2d8;
  Dim3 local_2d0;
  Dim3 local_2c0 [2];
  Dim3 local_2a0;
  undefined1 *local_290;
  undefined1 *local_270;
  undefined4 local_25c;
  undefined1 *local_258;
  undefined4 local_24c;
  undefined1 *local_248;
  undefined4 local_23c;
  undefined1 *local_238;
  Dim3 local_230;
  undefined1 *local_220;
  int local_218;
  int iStack_214;
  int local_210;
  undefined4 local_20c;
  int *local_208;
  undefined4 local_1fc;
  int *local_1f8;
  undefined4 local_1ec;
  int *local_1e8;
  Dim3 local_1e0;
  Dim3 local_1cc [2];
  Dim3 local_1b0;
  Box *local_1a0;
  Box *local_180;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_dc [2];
  Dim3 local_c0;
  Box *local_b0;
  Box *local_90;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  state_indx = (int)((ulong)in_stack_ffffffffffffe8d8 >> 0x20);
  local_2f8 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_300 = amrex::AmrLevel::get_old_data
                        ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                         state_indx);
  local_308 = amrex::AmrLevel::get_new_data
                        ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                         state_indx);
  local_310 = in_RDI[0x172];
  local_318 = amrex::AmrLevel::get_old_data
                        ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                         state_indx);
  local_320 = get_rho_half_time(in_stack_ffffffffffffeb10);
  local_4b8.hp = (Array4<double> *)0x0;
  MStack_4b0.hp = (Array4<const_double> *)0x0;
  local_4c8 = (pointer)0x0;
  pvStack_4c0 = (void *)0x0;
  local_4a8 = (pointer)0x0;
  amrex::MFInfo::MFInfo((MFInfo *)0x531457);
  mfi_00 = (MFIter *)
           amrex::AmrLevel::Factory
                     ((AmrLevel *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
  amrex::MultiFab::MultiFab
            (in_stack_ffffffffffffe920,in_stack_ffffffffffffe918,
             (DistributionMapping *)in_stack_ffffffffffffe910,
             (int)((ulong)in_stack_ffffffffffffe908 >> 0x20),(int)in_stack_ffffffffffffe908,
             (MFInfo *)in_stack_ffffffffffffe900,
             (FabFactory<amrex::FArrayBox> *)
             CONCAT44(in_stack_ffffffffffffe934,in_stack_ffffffffffffe930));
  amrex::MFInfo::~MFInfo((MFInfo *)0x5314ae);
  local_4f0._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       ((__uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
         *)(in_RDI + 0x170))->_M_t;
  local_4e8.m_arena = (Arena *)(in_RDI[0x170] + 0x180);
  local_4e0 = in_RDI[0x170] + 0x300;
  amrex::EB_average_face_to_cellcenter
            (in_stack_ffffffffffffed28,in_stack_ffffffffffffed24,in_stack_ffffffffffffed18);
  amrex::FArrayBox::FArrayBox
            ((FArrayBox *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
  amrex::FArrayBox::FArrayBox
            ((FArrayBox *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
  amrex::TilingIfNotGPU();
  amrex::MFIter::MFIter
            ((MFIter *)in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
             SUB81((ulong)in_stack_ffffffffffffe900 >> 0x38,0));
  while (bVar5 = amrex::MFIter::isValid((MFIter *)local_5e0), bVar5) {
    amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffe940);
    local_5e8 = &local_604;
    local_610 = amrex::FabArray<amrex::FArrayBox>::operator[]
                          ((FabArray<amrex::FArrayBox> *)
                           CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),mfi_00);
    amrex::FArrayBox::resize
              ((FArrayBox *)CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0),
               (Box *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e4,(Arena *)mfi_00);
    amrex::BaseFab<double>::elixir<double,_0>((BaseFab<double> *)in_stack_ffffffffffffe908);
    if (getForceVerbose != 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe910,(ostream *)in_stack_ffffffffffffe908);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (char (*) [4])mfi_00);
      local_7b1 = 10;
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (char *)mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (char (*) [43])mfi_00);
      local_7b2 = 10;
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (char *)mfi_00);
      amrex::Print::~Print(in_stack_ffffffffffffe950);
    }
    local_2d8 = local_5e0 + 0x60;
    local_290 = auStack_568;
    local_23c = 0;
    local_24c = 1;
    local_25c = 2;
    local_1e8 = &iStack_55c;
    local_1ec = 0;
    local_218 = iStack_55c + 1;
    local_1f8 = &iStack_55c;
    local_1fc = 1;
    iStack_214 = local_558 + 1;
    local_208 = &iStack_55c;
    local_20c = 2;
    local_2d0.z = iStack_554 + 1;
    local_2d0.y = iStack_214;
    local_2d0.x = local_218;
    local_2c0[0]._0_8_ = local_2d0._0_8_;
    local_2c0[0].z = local_2d0.z;
    local_270 = local_290;
    local_258 = local_290;
    local_248 = local_290;
    local_238 = local_290;
    local_230._0_8_ = local_2d0._0_8_;
    local_230.z = local_2d0.z;
    local_220 = local_290;
    local_210 = local_2d0.z;
    amrex::Array4<double>::Array4(&local_800,(double *)local_570,&local_2a0,local_2c0,local_54c);
    local_7c0 = &local_800;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0),
               (MFIter *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e4);
    local_808 = local_848;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0),
               (MFIter *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e4);
    local_958 = local_7c0->p;
    LStack_950 = local_7c0->jstride;
    local_948 = local_7c0->kstride;
    LStack_940 = local_7c0->nstride;
    uStack_938._0_4_ = (local_7c0->begin).x;
    uStack_938._4_4_ = (local_7c0->begin).y;
    uVar3 = *(undefined8 *)&(local_7c0->begin).z;
    uVar4 = (local_7c0->end).y;
    uStack_924 = *(undefined8 *)&(local_7c0->end).z;
    uStack_930 = (undefined4)uVar3;
    local_92c = (undefined4)((ulong)uVar3 >> 0x20);
    local_918 = *local_808;
    uStack_910 = local_808[1];
    local_908 = local_808[2];
    uStack_900 = local_808[3];
    uStack_8f8 = local_808[4];
    uStack_8e4 = *(undefined8 *)((long)local_808 + 0x34);
    uStack_8e8 = (undefined4)((ulong)*(undefined8 *)((long)local_808 + 0x2c) >> 0x20);
    uStack_8f0 = (undefined4)local_808[5];
    local_8ec = (undefined4)((ulong)local_808[5] >> 0x20);
    uStack_928 = uVar4;
    local_850 = local_890;
    amrex::ParallelFor<int,NavierStokesBase::velocity_advection_update(double)::__0,void>
              (in_stack_ffffffffffffe938,in_stack_ffffffffffffe934,
               (anon_class_192_3_3e8dcefc *)in_stack_ffffffffffffe928);
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),(size_type)mfi_00);
    RVar1 = amrex::StateData::prevTime
                      ((StateData *)CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0));
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
               CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),(size_type)mfi_00);
    RVar2 = amrex::StateData::curTime((StateData *)in_stack_ffffffffffffe900);
    local_960 = (RVar1 + RVar2) * 0.5;
    amrex::FArrayBox::resize
              ((FArrayBox *)CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0),
               (Box *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e4,(Arena *)mfi_00);
    in_stack_ffffffffffffe9a8 = &local_538;
    amrex::BaseFab<double>::elixir<double,_0>((BaseFab<double> *)in_stack_ffffffffffffe908);
    in_stack_ffffffffffffe8e8 = (FabArray<amrex::FArrayBox> *)local_5e0;
    mfi_00 = (MFIter *)(local_5e0 + 0x60);
    in_stack_ffffffffffffe8e0 = 0;
    (**(code **)(*in_RDI + 0x150))
              (SUB84(local_960,0),in_RDI,in_stack_ffffffffffffe9a8,local_5e8,0,3,local_610);
    if ((initial_iter != 0) &&
       (piVar6 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                            (size_type)mfi_00), *piVar6 != 0)) {
      local_2e0 = &local_538;
      local_1a0 = &local_538.super_BaseFab<double>.domain;
      local_14c = 0;
      local_15c = 1;
      local_16c = 2;
      local_f8 = &local_538.super_BaseFab<double>.domain.bigend;
      local_fc = 0;
      local_128 = local_538.super_BaseFab<double>.domain.bigend.vect[0] + 1;
      local_108 = &local_538.super_BaseFab<double>.domain.bigend;
      local_10c = 1;
      iStack_124 = local_538.super_BaseFab<double>.domain.bigend.vect[1] + 1;
      local_118 = &local_538.super_BaseFab<double>.domain.bigend;
      local_11c = 2;
      local_1e0.z = local_538.super_BaseFab<double>.domain.bigend.vect[2] + 1;
      local_1e0.y = iStack_124;
      local_1e0.x = local_128;
      local_1cc[0]._0_8_ = local_1e0._0_8_;
      local_1cc[0].z = local_1e0.z;
      local_180 = local_1a0;
      local_168 = local_1a0;
      local_158 = local_1a0;
      local_148 = local_1a0;
      local_140._0_8_ = local_1e0._0_8_;
      local_140.z = local_1e0.z;
      local_130 = local_1a0;
      local_120 = local_1e0.z;
      amrex::Array4<double>::Array4
                (&local_9c0,local_538.super_BaseFab<double>.dptr,&local_1b0,local_1cc,
                 local_538.super_BaseFab<double>.nvar);
      local_980 = &local_9c0;
      in_stack_ffffffffffffe9a0 = local_5e8;
      memcpy(local_a00,local_980,0x3c);
      amrex::ParallelFor<int,NavierStokesBase::velocity_advection_update(double)::__1,void>
                (in_stack_ffffffffffffe938,in_stack_ffffffffffffe934,
                 (anon_class_64_1_a7eb7a0b *)in_stack_ffffffffffffe928);
    }
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe8e8,
               (MFIter *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    local_a08 = local_a48;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe8e8,
               (MFIter *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    in_stack_ffffffffffffe990 = local_ad8;
    local_a50 = local_a90;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe8e8,
               (MFIter *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    local_2e8 = &local_538;
    local_b0 = &local_538.super_BaseFab<double>.domain;
    local_5c = 0;
    local_6c = 1;
    local_7c = 2;
    local_8 = &local_538.super_BaseFab<double>.domain.bigend;
    local_c = 0;
    local_38 = local_538.super_BaseFab<double>.domain.bigend.vect[0] + 1;
    local_18 = &local_538.super_BaseFab<double>.domain.bigend;
    local_1c = 1;
    iStack_34 = local_538.super_BaseFab<double>.domain.bigend.vect[1] + 1;
    local_28 = &local_538.super_BaseFab<double>.domain.bigend;
    local_2c = 2;
    local_f0.z = local_538.super_BaseFab<double>.domain.bigend.vect[2] + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_a98 = in_stack_ffffffffffffe990;
    local_dc[0]._0_8_ = local_f0._0_8_;
    local_dc[0].z = local_f0.z;
    local_90 = local_b0;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    amrex::Array4<double>::Array4
              (&local_b20,local_538.super_BaseFab<double>.dptr,&local_c0,local_dc,
               local_538.super_BaseFab<double>.nvar);
    local_ae0 = &local_b20;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe8e8,
               (MFIter *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    local_b28 = local_b68;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0),
               (MFIter *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e4);
    local_b70 = local_bb0;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffe8f4,in_stack_ffffffffffffe8f0),
               (MFIter *)in_stack_ffffffffffffe8e8,in_stack_ffffffffffffe8e4);
    local_bb8 = local_bf8;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffe8e8,
               (MFIter *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    local_c00 = local_c40;
    local_c44 = do_mom_diff;
    in_stack_ffffffffffffe998 = local_5e8;
    memcpy(local_e58,local_a08,0x3c);
    memcpy(auStack_e18,local_a50,0x3c);
    memcpy(auStack_dd8,local_a98,0x3c);
    memcpy(auStack_d98,local_ae0,0x3c);
    memcpy(auStack_d58,local_b28,0x3c);
    memcpy(auStack_d18,local_b70,0x3c);
    memcpy(auStack_cd8,local_bb8,0x3c);
    memcpy(auStack_c98,local_c00,0x3c);
    local_c58 = local_c44;
    local_c50 = local_2f8;
    amrex::ParallelFor<int,NavierStokesBase::velocity_advection_update(double)::__2,void>
              (in_stack_ffffffffffffe938,in_stack_ffffffffffffe934,in_stack_ffffffffffffe928);
    amrex::Gpu::Elixir::~Elixir
              ((Elixir *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    amrex::Gpu::Elixir::~Elixir
              ((Elixir *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    amrex::MFIter::operator++((MFIter *)local_5e0);
  }
  amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
  amrex::FArrayBox::~FArrayBox((FArrayBox *)0x53255c);
  amrex::FArrayBox::~FArrayBox((FArrayBox *)0x532569);
  for (local_e5c = 0; local_e5c < 3; local_e5c = local_e5c + 1) {
    bVar5 = amrex::MultiFab::contains_nan
                      ((MultiFab *)in_stack_ffffffffffffe900,
                       (int)((ulong)in_stack_ffffffffffffe8f8 >> 0x20),
                       (int)in_stack_ffffffffffffe8f8,in_stack_ffffffffffffe8f4,
                       SUB41((uint)in_stack_ffffffffffffe8f0 >> 0x18,0));
    if (bVar5) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe910,(ostream *)in_stack_ffffffffffffe908);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (char (*) [19])mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (int *)mfi_00);
      in_stack_ffffffffffffe950 =
           amrex::Print::operator<<
                     ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                      (char (*) [15])mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)mfi_00);
      amrex::Print::~Print(in_stack_ffffffffffffe950);
      amrex::IntVect::IntVect(local_ff4,-100,100,-100);
      amrex::MFIter::MFIter
                ((MFIter *)in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
                 (uchar)((ulong)in_stack_ffffffffffffe900 >> 0x38));
      while (bVar5 = amrex::MFIter::isValid(&local_1058), bVar5) {
        amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffe940);
        local_1060 = local_107c;
        amrex::FabArray<amrex::FArrayBox>::operator[]
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),mfi_00);
        bVar5 = amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
                          (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,
                           (int)((ulong)in_stack_ffffffffffffe998 >> 0x20),
                           (int)in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
        if (bVar5) {
          amrex::OutStream();
          amrex::Print::Print(in_stack_ffffffffffffe910,(ostream *)in_stack_ffffffffffffe908);
          in_stack_ffffffffffffe940 =
               amrex::Print::operator<<
                         ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                          (char (*) [10])mfi_00);
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                     (IntVect *)mfi_00);
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                     (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                      *)mfi_00);
          amrex::Print::~Print(in_stack_ffffffffffffe950);
        }
        amrex::MFIter::operator++(&local_1058);
      }
      amrex::MFIter::~MFIter
                ((MFIter *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    }
    bVar5 = amrex::MultiFab::contains_nan
                      ((MultiFab *)in_stack_ffffffffffffe900,
                       (int)((ulong)in_stack_ffffffffffffe8f8 >> 0x20),
                       (int)in_stack_ffffffffffffe8f8,in_stack_ffffffffffffe8f4,
                       SUB41((uint)in_stack_ffffffffffffe8f0 >> 0x18,0));
    if (bVar5) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe910,(ostream *)in_stack_ffffffffffffe908);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (char (*) [19])mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (int *)mfi_00);
      in_stack_ffffffffffffe910 =
           amrex::Print::operator<<
                     ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                      (char (*) [15])mfi_00);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                 (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                  *)mfi_00);
      amrex::Print::~Print(in_stack_ffffffffffffe950);
      amrex::IntVect::IntVect(local_139c,-100,100,-100);
      amrex::MFIter::MFIter
                ((MFIter *)in_stack_ffffffffffffe910,in_stack_ffffffffffffe908,
                 (uchar)((ulong)in_stack_ffffffffffffe900 >> 0x38));
      while (bVar5 = amrex::MFIter::isValid(&local_1400), bVar5) {
        amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffe940);
        local_1408 = local_1424;
        amrex::FabArray<amrex::FArrayBox>::operator[]
                  ((FabArray<amrex::FArrayBox> *)
                   CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),mfi_00);
        bVar5 = amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
                          (in_stack_ffffffffffffe9a8,in_stack_ffffffffffffe9a0,
                           (int)((ulong)in_stack_ffffffffffffe998 >> 0x20),
                           (int)in_stack_ffffffffffffe998,in_stack_ffffffffffffe990);
        if (bVar5) {
          in_stack_ffffffffffffe908 = (FabArrayBase *)amrex::OutStream();
          amrex::Print::Print(in_stack_ffffffffffffe910,(ostream *)in_stack_ffffffffffffe908);
          in_stack_ffffffffffffe900 =
               amrex::Print::operator<<
                         ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                          (char (*) [10])mfi_00);
          in_stack_ffffffffffffe8f8 =
               amrex::Print::operator<<
                         ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                          (IntVect *)mfi_00);
          amrex::Print::operator<<
                    ((Print *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0),
                     (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                      *)mfi_00);
          amrex::Print::~Print(in_stack_ffffffffffffe950);
        }
        amrex::MFIter::operator++(&local_1400);
      }
      amrex::MFIter::~MFIter
                ((MFIter *)CONCAT44(in_stack_ffffffffffffe8e4,in_stack_ffffffffffffe8e0));
    }
  }
  amrex::MultiFab::~MultiFab((MultiFab *)0x532acd);
  return;
}

Assistant:

void
NavierStokesBase::velocity_advection_update (Real dt)
{
    BL_PROFILE("NavierStokesBase::velocity_advection_update()");

    MultiFab&  U_old          = get_old_data(State_Type);
    MultiFab&  U_new          = get_new_data(State_Type);
    MultiFab&  Aofs           = *aofs;
    MultiFab&  Gp    = get_old_data(Gradp_Type);
    MultiFab& Rh = get_rho_half_time();

    MultiFab Vel(grids, dmap, AMREX_SPACEDIM, 0, MFInfo(), Factory());
    //
    // Average mac face velocity to cell-centers for use in generating external
    // forcing term in getForce()
    // NOTE that default getForce() does not use Vel or Scal, user must supply the
    // forcing function for that case.
    //
#ifdef AMREX_USE_EB
    // FIXME - this isn't quite right because it's face-centers to cell-centers
    // what's really wanted is face-centroid to cell-centroid
    EB_average_face_to_cellcenter(Vel, 0, Array<MultiFab const*,AMREX_SPACEDIM>{{AMREX_D_DECL(&u_mac[0],&u_mac[1],&u_mac[2])}});
#else
    average_face_to_cellcenter(Vel, 0, Array<MultiFab const*,AMREX_SPACEDIM>{{AMREX_D_DECL(&u_mac[0],&u_mac[1],&u_mac[2])}});
#endif

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
{
    FArrayBox  tforces, ScalFAB;

    for (MFIter mfi(Rh,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        FArrayBox& VelFAB = Vel[mfi];
        ScalFAB.resize(bx,NUM_SCALARS);
        Elixir scal_i = ScalFAB.elixir();

        //
        // Need to do some funky half-time stuff.
        //
        if (getForceVerbose)
           amrex::Print() << "---" << '\n' << "F - velocity advection update (half time):" << '\n';
        //
        // Average the new and old time to get Crank-Nicholson half time approximation.
        // Scalars always get updated before velocity (see NavierStokes::advance), so
        // this is garanteed to be good.
        //
        auto const& scal = ScalFAB.array();
        auto const& scal_o = U_old.array(mfi,Density);
        auto const& scal_n = U_new.array(mfi,Density);
        amrex::ParallelFor(bx, NUM_SCALARS, [scal, scal_o, scal_n]
	AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            scal(i,j,k,n) = 0.5 * ( scal_o(i,j,k,n) + scal_n(i,j,k,n) );
        });

        const Real half_time = 0.5*(state[State_Type].prevTime()+state[State_Type].curTime());
        tforces.resize(bx,AMREX_SPACEDIM);
        Elixir tf_i = tforces.elixir();
        getForce(tforces,bx,Xvel,AMREX_SPACEDIM,half_time,VelFAB,ScalFAB,0,mfi);

        //
        // Do following only at initial iteration--per JBB.
        //
        if (initial_iter && is_diffusive[Xvel]) {
           auto const& force  = tforces.array();
           amrex::ParallelFor(bx, AMREX_SPACEDIM, [force]
	   AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
           {
	       force(i,j,k,n) = 0.0;
           });
        }

        // Update velocity
        auto const& vel_old  = U_old.array(mfi);
        auto const& vel_new  = U_new.array(mfi);
        auto const& gradp    = Gp.array(mfi);
        auto const& force    = tforces.array();
        auto const& advec    = Aofs.array(mfi);
        auto const& rho_old  = U_old.array(mfi, Density);
        auto const& rho_new  = U_new.array(mfi, Density);
        auto const& rho_Half = Rh.array(mfi);
        int mom_diff = do_mom_diff;
        amrex::ParallelFor(bx, AMREX_SPACEDIM, [vel_old,vel_new,gradp,force,advec,rho_old,rho_new,rho_Half,mom_diff,dt]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real velold = vel_old(i,j,k,n);

            if ( mom_diff ) {
               velold *= rho_old(i,j,k);
	       vel_new(i,j,k,n) = velold - dt * advec(i,j,k,n)
		                         + dt * force(i,j,k,n)
		                         - dt * gradp(i,j,k,n);

	       vel_new(i,j,k,n) /= rho_new(i,j,k);
            }
	    else
	    {
	        vel_new(i,j,k,n) = velold - dt * advec(i,j,k,n)
                                          + dt * force(i,j,k,n) / rho_Half(i,j,k)
                                          - dt * gradp(i,j,k,n) / rho_Half(i,j,k);
            }
        });
    }
}

    for (int sigma = 0; sigma < AMREX_SPACEDIM; sigma++)
    {
       if (U_old.contains_nan(sigma,1,0))
       {
	 amrex::Print() << "VAU: Old velocity " << sigma << " contains Nans" << std::endl;

	 IntVect mpt(D_DECL(-100,100,-100));
	 for (MFIter mfi(U_old); mfi.isValid(); ++mfi){
	   const Box& bx = mfi.tilebox();
	   if ( U_old[mfi].contains_nan<RunOn::Host>(bx, sigma, 1, mpt) )
	     amrex::Print() << " Nans at " << mpt << std::endl;
	 }
       }
       if (U_new.contains_nan(sigma,1,0))
       {
	 amrex::Print() << "VAU: New velocity " << sigma << " contains Nans" << std::endl;

	 IntVect mpt(D_DECL(-100,100,-100));
	 for (MFIter mfi(U_new); mfi.isValid(); ++mfi){
	   const Box& bx = mfi.tilebox();
	   if ( U_new[mfi].contains_nan<RunOn::Host>(bx, sigma, 1, mpt) )
	     amrex::Print() << " Nans at " << mpt << std::endl;
	 }
       }
    }
}